

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>
::ComputeViolations(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>
                    *this,SolCheck *chk)

{
  iterator *this_00;
  int *piVar1;
  _Map_pointer ppCVar2;
  int iVar3;
  long lVar4;
  reference pCVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  allocator<char> local_61;
  mapped_type *local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *local_58;
  key_type local_50;
  
  ppCVar2 = (this->cons_).
            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar4 = ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x6db6db6db6db6db7 +
          ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x6db6db6db6db6db7 +
          (((long)ppCVar2 -
            (long)(this->cons_).
                  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 9;
  if ((lVar4 != 0) && (iVar3 = (int)lVar4, iVar3 != 0)) {
    this_00 = &(this->cons_).
               super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container>_>
               ._M_impl.super__Deque_impl_data._M_start;
    local_58 = &chk->viol_cons_log_;
    lVar4 = (long)iVar3;
    local_60 = (mapped_type *)0x0;
    do {
      lVar4 = lVar4 + -1;
      pCVar5 = std::
               _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_*>
               ::operator[](this_00,lVar4);
      if (pCVar5->is_unused_ == '\0') {
        pCVar5 = std::
                 _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_*>
                 ::operator[](this_00,lVar4);
        bVar10 = pCVar5->is_bridged_ == '\0';
        pCVar5 = std::
                 _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_*>
                 ::operator[](this_00,lVar4);
        if (pCVar5->depth_ == 0) {
          uVar8 = (uint)bVar10 * 8 + 2;
        }
        else {
          uVar8 = (uint)bVar10 << 3;
        }
        uVar9 = 4;
        if (uVar8 != 0) {
          uVar9 = uVar8;
        }
        if (((chk->check_mode_ & uVar9) != 0) &&
           (std::
            _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_*>
            ::operator[](this_00,lVar4), chk->feastol_ <= 0.0 && chk->feastol_ != 0.0)) {
          if (local_60 == (mapped_type *)0x0) {
            pcVar6 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar6,&local_61)
            ;
            local_60 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                       ::operator[](local_58,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          lVar7 = 2 - (ulong)(uVar9 < 8);
          if ((uVar9 & 2) != 0) {
            lVar7 = 0;
          }
          piVar1 = &local_60->_M_elems[0].N_ + (lVar7 * 5 & 0xffffffffU) * 2;
          pCVar5 = std::
                   _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<0>_>::Container_*>
                   ::operator[](this_00,lVar4);
          pcVar6 = (pCVar5->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
          *piVar1 = *piVar1 + 1;
          if (*(double *)(piVar1 + 2) <= 0.0 && *(double *)(piVar1 + 2) != 0.0) {
            *(double *)(piVar1 + 2) = 0.0;
            *(char **)(piVar1 + 4) = pcVar6;
          }
          if (*(double *)(piVar1 + 6) <= 0.0 && *(double *)(piVar1 + 6) != 0.0) {
            *(double *)(piVar1 + 6) = 0.0;
            *(char **)(piVar1 + 8) = pcVar6;
          }
        }
      }
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void ComputeViolations(SolCheck& chk) override {
    if (cons_.size()) {
      auto& conviolmap =
          cons_.front().GetCon().IsLogical() ?
            chk.ConViolLog() :
            chk.ConViolAlg();
      const auto& x = chk.x_ext();
      ViolSummArray<3>* conviolarray {nullptr};
      for (int i=(int)cons_.size(); i--; ) {
        if (!cons_[i].IsUnused()) {
          int c_class = 0;    // class of this constraint
          if (!cons_[i].IsBridged())
            c_class |= 8;     // solver-side constraint
          if (!cons_[i].GetDepth())
            c_class |= 2;     // top-level
          if (!c_class)
            c_class = 4;      // intermediate
          if (c_class & chk.check_mode()) {
            auto viol = cons_[i].GetCon().ComputeViolation(x);
            auto cr = viol.Check(
                  chk.GetFeasTol(), chk.GetFeasTolRel());
            if (cr.first) {
              if (!conviolarray)
                conviolarray =         // lazy map access
                    &conviolmap[GetShortTypeName()];
              /// index==0,1,2: original, interm, solver-side
              /// If both orig and solver, report as orig
              int index = (c_class & 2) ? 0
                                        : (c_class & 8)
                                          ? 2 : 1;
              assert(index < (int)conviolarray->size());
              (*conviolarray)[index].CountViol(
                    viol, cr.second, cons_[i].GetCon().name());
            }
          }
        }
      }
    }
  }